

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

void __thiscall
logUnits_negbase50000_Test::logUnits_negbase50000_Test(logUnits_negbase50000_Test *this)

{
  logUnits_negbase50000_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__logUnits_negbase50000_Test_002412b0;
  return;
}

Assistant:

TEST(logUnits, negbase50000)
{
    EXPECT_EQ(convert(50000.0, precise::one, precise::log::neglog50000), -1.0);
    EXPECT_EQ(
        convert(50000.0 * 50000.0, precise::one, precise::log::neglog50000),
        -2.0);
    EXPECT_EQ(
        convert(1.0 / 50000.0, precise::one, precise::log::neglog50000), 1.0);
    EXPECT_EQ(
        convert(
            1.0 / (50000.0 * 50000.0), precise::one, precise::log::neglog50000),
        2.0);
    EXPECT_EQ(convert(-1.0, precise::log::neglog50000, precise::one), 50000.0);
    EXPECT_EQ(
        convert(1.0, precise::log::neglog50000, precise::one), 1.0 / 50000.0);
    EXPECT_EQ(
        convert(-2.0, precise::log::neglog50000, precise::one),
        (50000.0 * 50000.0));
    EXPECT_DOUBLE_EQ(
        convert(2.0, precise::log::neglog50000, precise::one),
        1.0 / (50000.0 * 50000.0));
}